

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestzeroesInKeys::runTestCase(TestValueTestzeroesInKeys *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  Value *pVVar4;
  Value *this_00;
  Value *this_01;
  long in_RDI;
  bool did;
  Value removed;
  Value root;
  string binary;
  char cstr [4];
  Value *in_stack_fffffffffffffcb8;
  char *pcVar5;
  Value *in_stack_fffffffffffffcc0;
  uint uVar7;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffcc8;
  ValueType in_stack_fffffffffffffccc;
  undefined4 uVar8;
  Value *in_stack_fffffffffffffcd0;
  uint line;
  Value *in_stack_fffffffffffffcd8;
  Value *pVVar9;
  TestResult *in_stack_fffffffffffffce0;
  TestResult *this_02;
  Value *in_stack_fffffffffffffce8;
  Value *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffd40;
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  string local_210 [39];
  undefined1 local_1e9 [33];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  undefined1 local_179;
  Value *in_stack_fffffffffffffed8;
  allocator local_101;
  string local_100 [32];
  string local_e0 [39];
  undefined1 local_b9 [136];
  allocator local_31;
  undefined4 local_c;
  
  local_c = 0x690068;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,(char *)&stack0xfffffffffffffff4,4,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::length();
  JsonTest::checkEqual<unsigned_int,unsigned_long>
            (in_stack_fffffffffffffce0,(uint)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
             (unsigned_long)in_stack_fffffffffffffcd0,
             (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),(char *)in_stack_fffffffffffffcb8);
  Json::Value::Value(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  Json::Value::Value(in_stack_fffffffffffffcd0,
                     (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  Json::Value::operator[]
            (in_stack_fffffffffffffcd0,
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  Json::Value::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  uVar7 = (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
  Json::Value::~Value(in_stack_fffffffffffffcf0);
  pcVar5 = *(char **)(in_RDI + 8);
  pVVar9 = (Value *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b9 + 1),"there",(allocator *)pVVar9);
  pVVar4 = Json::Value::operator[]
                     (in_stack_fffffffffffffcd0,
                      (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffed8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8,
             (string *)in_stack_fffffffffffffcd0,
             (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),uVar7,
             (char *)in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  uVar1 = Json::Value::isMember
                    (in_stack_fffffffffffffcd0,
                     (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  if ((bool)uVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
               (uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  uVar2 = Json::Value::isMember
                    (in_stack_fffffffffffffcd0,
                     (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  if (!(bool)uVar2) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
               (uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"there",&local_101);
  Json::Value::get(in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0,
                   in_stack_fffffffffffffcd8);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffed8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8,
             (string *)in_stack_fffffffffffffcd0,
             (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),uVar7,
             (char *)in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  Json::Value::~Value(in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  Json::Value::Value(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  std::__cxx11::string::data();
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  local_179 = Json::Value::removeMember
                        (pVVar9,pcVar5,(char *)pVVar4,
                         (Value *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffd40)));
  if (!(bool)local_179) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
               (uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"there",&local_1a1);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffed8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8,
             (string *)in_stack_fffffffffffffcd0,
             (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),uVar7,
             (char *)in_stack_fffffffffffffcb8);
  line = (uint)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  this_02 = (TestResult *)&stack0xffffffffffffffd0;
  this_00 = (Value *)std::__cxx11::string::data();
  this_01 = (Value *)std::__cxx11::string::data();
  std::__cxx11::string::length();
  local_179 = Json::Value::removeMember
                        (pVVar9,pcVar5,(char *)pVVar4,
                         (Value *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffd40)));
  if ((bool)local_179) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)in_stack_fffffffffffffcd8,line,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  pVVar4 = *(Value **)(in_RDI + 8);
  pVVar9 = (Value *)local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1e9 + 1),"there",(allocator *)pVVar9);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffed8);
  JsonTest::checkStringEqual
            (this_02,(string *)pVVar9,(string *)pVVar4,
             (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),uVar7,
             (char *)in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string((string *)(local_1e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1e9);
  bVar3 = Json::Value::isMember
                    (pVVar4,(string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
  ;
  uVar8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffccc);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              (this_02,(char *)pVVar9,(uint)((ulong)pVVar4 >> 0x20),
               (char *)CONCAT44(uVar8,in_stack_fffffffffffffcc8));
  }
  pcVar5 = *(char **)(in_RDI + 8);
  paVar6 = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"",paVar6);
  uVar7 = (uint)((ulong)paVar6 >> 0x20);
  Json::Value::get(this_01,(string *)this_02,pVVar9);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffed8);
  JsonTest::checkStringEqual
            (this_02,(string *)pVVar9,(string *)pVVar4,
             (char *)CONCAT44(uVar8,in_stack_fffffffffffffcc8),uVar7,pcVar5);
  std::__cxx11::string::~string(local_258);
  Json::Value::~Value(this_00);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, zeroesInKeys) {
  char const cstr[] = "h\0i";
  std::string binary(cstr, sizeof(cstr));  // include trailing 0
  JSONTEST_ASSERT_EQUAL(4U, binary.length());
  {
    Json::Value root;
    root[binary] = "there";
    JSONTEST_ASSERT_STRING_EQUAL("there", root[binary].asString());
    JSONTEST_ASSERT(!root.isMember("h"));
    JSONTEST_ASSERT(root.isMember(binary));
    JSONTEST_ASSERT_STRING_EQUAL("there", root.get(binary, Json::Value::nullRef).asString());
    Json::Value removed;
    bool did;
    did = root.removeMember(binary.data(), binary.data() + binary.length(),
        &removed);
    JSONTEST_ASSERT(did);
    JSONTEST_ASSERT_STRING_EQUAL("there", removed.asString());
    did = root.removeMember(binary.data(), binary.data() + binary.length(),
        &removed);
    JSONTEST_ASSERT(!did);
    JSONTEST_ASSERT_STRING_EQUAL("there", removed.asString()); // still
    JSONTEST_ASSERT(!root.isMember(binary));
    JSONTEST_ASSERT_STRING_EQUAL("", root.get(binary, Json::Value::nullRef).asString());
  }
}